

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<long_double,_3>::Expand(TPZManVector<long_double,_3> *this,int64_t newsize)

{
  longdouble *plVar1;
  longdouble *plVar2;
  long lVar3;
  long lVar4;
  
  if ((3 < newsize) && ((this->super_TPZVec<long_double>).fNAlloc < newsize)) {
    plVar2 = (longdouble *)operator_new__(-(ulong)((ulong)newsize >> 0x3c != 0) | newsize << 4);
    plVar1 = (this->super_TPZVec<long_double>).fStore;
    lVar3 = (this->super_TPZVec<long_double>).fNElements;
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        *(unkbyte10 *)((long)plVar2 + lVar4) = *(unkbyte10 *)((long)plVar1 + lVar4);
        lVar4 = lVar4 + 0x10;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    if (plVar1 != (longdouble *)0x0 && plVar1 != this->fExtAlloc) {
      operator_delete__(plVar1);
    }
    (this->super_TPZVec<long_double>).fStore = plVar2;
    (this->super_TPZVec<long_double>).fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Expand(const int64_t newsize) {
    // If newsize is negative then return.
    if (newsize <= this->fNAlloc || newsize <= NumExtAlloc) {
        return;
    } else {// the size is larger than the allocated memory
        T* newstore = new T[ newsize ];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc) {
            delete [] this->fStore;
        }

        this->fStore = newstore;
        this->fNAlloc = newsize;
    }
}